

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void update_idle_timeout(quicly_conn_t *conn,int is_in_receive)

{
  quicly_context_t *pqVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  
  if ((is_in_receive != 0) || (((conn->idle_timeout).field_0x8 & 1) != 0)) {
    uVar5 = 0x7fffffffffffffff;
    if ((conn->initial == (st_quicly_handshake_space_t *)0x0) &&
       ((uVar5 = 0x7fffffffffffffff, conn->handshake == (st_quicly_handshake_space_t *)0x0 &&
        (uVar5 = (conn->super).remote.transport_params.max_idle_timeout, uVar5 == 0)))) {
      uVar5 = 0x7fffffffffffffff;
    }
    pqVar1 = (conn->super).ctx;
    uVar2 = (pqVar1->transport_params).max_idle_timeout;
    uVar3 = uVar5;
    if (uVar2 < uVar5) {
      uVar3 = uVar2;
    }
    if (uVar2 == 0) {
      uVar3 = uVar5;
    }
    if (uVar3 != 0x7fffffffffffffff) {
      uVar4 = (conn->egress).loss.rtt.variance;
      if (uVar4 == 0) {
        uVar4 = ((conn->egress).loss.conf)->min_pto;
      }
      else {
        uVar4 = uVar4 << 2;
      }
      uVar5 = (ulong)(((uint)(pqVar1->transport_params).max_ack_delay +
                       (conn->egress).loss.rtt.smoothed + uVar4) * 3);
      if ((long)uVar5 < (long)uVar3) {
        uVar5 = uVar3;
      }
      (conn->idle_timeout).at = uVar5 + (conn->stash).now;
      (conn->idle_timeout).field_0x8 =
           (conn->idle_timeout).field_0x8 & 0xfe | (byte)is_in_receive & 1;
    }
  }
  return;
}

Assistant:

static void update_idle_timeout(quicly_conn_t *conn, int is_in_receive)
{
    if (!is_in_receive && !conn->idle_timeout.should_rearm_on_send)
        return;

    /* calculate the minimum of the two max_idle_timeout */
    int64_t idle_msec = INT64_MAX;
    if (conn->initial == NULL && conn->handshake == NULL && conn->super.remote.transport_params.max_idle_timeout != 0)
        idle_msec = conn->super.remote.transport_params.max_idle_timeout;
    if (conn->super.ctx->transport_params.max_idle_timeout != 0 && conn->super.ctx->transport_params.max_idle_timeout < idle_msec)
        idle_msec = conn->super.ctx->transport_params.max_idle_timeout;

    if (idle_msec == INT64_MAX)
        return;

    uint32_t three_pto = 3 * quicly_rtt_get_pto(&conn->egress.loss.rtt, conn->super.ctx->transport_params.max_ack_delay,
                                                conn->egress.loss.conf->min_pto);
    conn->idle_timeout.at = conn->stash.now + (idle_msec > three_pto ? idle_msec : three_pto);
    conn->idle_timeout.should_rearm_on_send = is_in_receive;
}